

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O3

void __thiscall
Assimp::ZipArchiveIOSystem::Implement::getFileListExtension
          (Implement *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rFileList,string *extension)

{
  size_t __n;
  _Alloc_hider _Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  string local_50;
  
  MapArchive(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(rFileList,
                    (rFileList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  for (p_Var3 = (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    BaseImporter::GetExtension(&local_50,(string *)(p_Var3 + 1));
    _Var1._M_p = local_50._M_dataplus._M_p;
    __n = extension->_M_string_length;
    if (__n == local_50._M_string_length) {
      if (__n == 0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp((extension->_M_dataplus)._M_p,local_50._M_dataplus._M_p,__n);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var1._M_p != &local_50.field_2) {
      operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(rFileList,(value_type *)(p_Var3 + 1));
    }
  }
  return;
}

Assistant:

void ZipArchiveIOSystem::Implement::getFileListExtension(std::vector<std::string>& rFileList, const std::string& extension) {
        MapArchive();
        rFileList.clear();

        for (const auto &file : m_ArchiveMap) {
            if (extension == BaseImporter::GetExtension(file.first))
                rFileList.push_back(file.first);
        }
    }